

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerSafe::
GetCommissionerDataset(std::function<void(ot::commissioner::CommissionerDataset_const*,ot::commissioner::Error)>,unsigned_short)
::$_0::~__0(__0 *this)

{
  anon_class_48_3_e6543253 *this_local;
  
  std::function<void_(const_ot::commissioner::CommissionerDataset_*,_ot::commissioner::Error)>::
  ~function((function<void_(const_ot::commissioner::CommissionerDataset_*,_ot::commissioner::Error)>
             *)(this + 8));
  return;
}

Assistant:

Error CommissionerSafe::GetCommissionerDataset(CommissionerDataset &aDataset, uint16_t aDatasetFlags)
{
    std::promise<Error> pro;
    auto                wait = [&pro, &aDataset](const CommissionerDataset *dataset, Error error) {
        if (dataset != nullptr)
        {
            aDataset = *dataset;
        }
        pro.set_value(error);
    };

    GetCommissionerDataset(wait, aDatasetFlags);
    return pro.get_future().get();
}